

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O1

int it_xm_read_sample_data(IT_SAMPLE *sample,uchar roguebytes,DUMBFILE *f)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  uint uVar6;
  int *piVar7;
  void *pvVar8;
  int iVar9;
  int32 iVar10;
  int iVar11;
  char *ptr;
  void *pvVar12;
  long lVar13;
  short *psVar14;
  ulong uVar15;
  ulong uVar16;
  short sVar17;
  char cVar18;
  short sVar19;
  
  if ((sample->flags & 1) == 0) {
    iVar9 = dumbfile_skip(f,(ulong)roguebytes);
    return iVar9;
  }
  iVar9 = sample->length;
  ptr = (char *)malloc((long)iVar9);
  sample->data = ptr;
  if (ptr == (char *)0x0) {
    return -1;
  }
  if (roguebytes == '\x04') {
    iVar10 = _dumb_it_read_sample_data_adpcm4(sample,f);
    return iVar10 >> 0x1f;
  }
  dumbfile_getnc(ptr,iVar9,f);
  iVar11 = dumbfile_error(f);
  if (iVar11 != 0) {
    return -1;
  }
  piVar7 = (int *)sample->data;
  if ((piVar7[1] == 0x5367674f) &&
     (piVar7[9] == 0x736962 && *(int *)((long)piVar7 + 0x21) == 0x62726f76)) {
    bVar5 = sample->flags;
    iVar11 = *piVar7 << ((bVar5 & 2) == 0);
    if ((bVar5 & 4) != 0) {
      sample->flags = bVar5 & 0xfb;
      iVar11 = iVar11 >> 1;
      uVar1 = sample->loop_start;
      uVar3 = sample->loop_end;
      sample->loop_start = (int)uVar1 >> 1;
      sample->loop_end = (int)uVar3 >> 1;
    }
    psVar14 = dumb_decode_vorbis(iVar11,piVar7 + 1,iVar9 + -4);
    if (psVar14 != (short *)0x0) {
      free(sample->data);
      sample->data = psVar14;
      sample->length = iVar11;
      if ((sample->flags & 2) == 0) {
        sample->flags = sample->flags | 2;
        uVar2 = sample->loop_start;
        uVar4 = sample->loop_end;
        sample->loop_start = uVar2 * 2;
        sample->loop_end = uVar4 * 2;
      }
      it_xm_fixup_sample_points(sample);
      return 0;
    }
  }
  it_xm_fixup_sample_points(sample);
  bVar5 = sample->flags;
  sVar17 = 0;
  if ((bVar5 & 4) == 0) goto LAB_006dfead;
  uVar6 = sample->length;
  uVar16 = (ulong)uVar6;
  pvVar12 = malloc((long)(int)(uVar6 << (2U - ((bVar5 & 2) == 0) & 0x1f)));
  if (pvVar12 == (void *)0x0) {
    sample->flags = bVar5 & 0xfb;
LAB_006dfe99:
    sVar17 = 0;
  }
  else if ((bVar5 & 2) == 0) {
    if ((int)uVar6 < 1) goto LAB_006dfe99;
    pvVar8 = sample->data;
    uVar15 = 0;
    cVar18 = '\0';
    sVar17 = 0;
    do {
      sVar17 = sVar17 + *(char *)((long)pvVar8 + uVar15);
      *(char *)((long)pvVar12 + uVar15 * 2) = (char)sVar17;
      cVar18 = cVar18 + *(char *)((long)pvVar8 + uVar15 + uVar16);
      *(char *)((long)pvVar12 + uVar15 * 2 + 1) = cVar18;
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  else {
    if ((int)uVar6 < 1) goto LAB_006dfe99;
    pvVar8 = sample->data;
    uVar15 = 0;
    sVar19 = 0;
    do {
      sVar17 = sVar17 + *(short *)((long)pvVar8 + uVar15 * 2);
      *(short *)((long)pvVar12 + uVar15 * 4) = sVar17;
      sVar19 = sVar19 + *(short *)((long)pvVar8 + uVar15 * 2 + uVar16 * 2);
      *(short *)((long)pvVar12 + uVar15 * 4 + 2) = sVar19;
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  if (pvVar12 != (void *)0x0) {
    free(sample->data);
    sample->data = pvVar12;
  }
LAB_006dfead:
  if ((sample->flags & 4) == 0) {
    uVar6 = sample->length;
    if ((sample->flags & 2) == 0) {
      if (0 < (int)uVar6) {
        lVar13 = 0;
        do {
          sVar17 = sVar17 + (ushort)*(byte *)((long)sample->data + lVar13);
          *(char *)((long)sample->data + lVar13) = (char)sVar17;
          lVar13 = lVar13 + 1;
        } while (lVar13 < sample->length);
      }
    }
    else if (0 < (int)uVar6) {
      pvVar12 = sample->data;
      uVar16 = 0;
      do {
        sVar17 = sVar17 + *(short *)((long)pvVar12 + uVar16 * 2);
        *(short *)((long)pvVar12 + uVar16 * 2) = sVar17;
        uVar16 = uVar16 + 1;
      } while (uVar6 != uVar16);
    }
  }
  return 0;
}

Assistant:

static int it_xm_read_sample_data(IT_SAMPLE *sample, unsigned char roguebytes, DUMBFILE *f)
{
	int old;
	int32 i;
//	long truncated_size;
	int n_channels;
	int32 datasizebytes;

	if (!(sample->flags & IT_SAMPLE_EXISTS))
		return dumbfile_skip(f, roguebytes);

#if 0
	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length && roguebytes != 4) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}
#endif
	n_channels = sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
	datasizebytes = sample->length;

	sample->data = malloc(datasizebytes);
	if (!sample->data)
		return -1;

	if (roguebytes == 4)
	{
		if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
			return -1;
		return 0;
	}

	dumbfile_getnc(sample->data, datasizebytes, f);

	if (dumbfile_error(f))
		return -1;

	/* FMOD extension: Samples compressed with Ogg Vorbis */
	if (!memcmp((char *)sample->data + 4, "OggS", 4) &&
		!memcmp((char *)sample->data + 33, "vorbis", 7))
	{
		int32 outlen = ((unsigned char *)(sample->data))[0] |
					  (((unsigned char *)(sample->data))[1] << 8) |
					  (((unsigned char *)(sample->data))[2] << 16) |
					  (((unsigned char *)(sample->data))[3] << 24);
		short *output;

		if (!(sample->flags & IT_SAMPLE_16BIT))
		{
			/* Because it'll be 16-bit when we're done with it. */
			outlen <<= 1;
		}

		if (sample->flags & IT_SAMPLE_STEREO)
		{
			/* OggMod knows nothing of stereo samples and compresses them as mono,
			 * screwing up the second channel. (Because for whatever reason,
			 * ModPlug delta encodes them independantly, even though it presents
			 * the sample as a double-length mono sound to other players.)
			 */
			sample->flags &= ~IT_SAMPLE_STEREO;
			outlen >>= 1;
			sample->loop_start >>= 1;
			sample->loop_end >>= 1;
		}
		output = dumb_decode_vorbis(outlen, (char *)sample->data + 4, datasizebytes - 4);
		if (output != NULL)
		{
			free(sample->data);
			sample->data = output;
			sample->length = outlen;
			if (!(sample->flags & IT_SAMPLE_16BIT))
			{
				sample->flags |= IT_SAMPLE_16BIT;
				sample->loop_start <<= 1;
				sample->loop_end <<= 1;
			}

			it_xm_fixup_sample_points(sample);
			return 0;
		}
		/* Decode failed, so assume it's normal sample data that just so
		 * happened to look like a Vorbis stream. (Not likely to happen
		 * by coincidence!) */
	}

	it_xm_fixup_sample_points(sample);

	/* sample data is stored as signed delta values */
	old = 0;
	if (sample->flags & IT_SAMPLE_STEREO)
	{
		/* Stereo samples are a ModPlug extension, so to keep compatibility with
		 * players that don't know about it (and FastTracker 2 itself), the two
		 * channels are not stored interleaved but rather, one after the other. */
		int old_r = 0;
		void *ibuffer = malloc(sample->length << ((sample->flags & IT_SAMPLE_16BIT) ? 2 : 1));
		if (ibuffer == NULL)
		{
			/* No memory => ignore stereo bits at the end */
			sample->flags &= ~IT_SAMPLE_STEREO;
		}
		else if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
			{
				((short *)ibuffer)[i*2]   = old += iswapw(((short *)sample->data)[i]);
				((short *)ibuffer)[i*2+1] = old_r += iswapw(((short *)sample->data)[i + sample->length]);
			}
		}
		else
		{
			for (i = 0; i < sample->length; i++)
			{
				((char *)ibuffer)[i*2]   = old += ((char *)sample->data)[i];
				((char *)ibuffer)[i*2+1] = old_r += ((char *)sample->data)[i + sample->length];
			}
		}
		if (ibuffer != NULL)
		{
			free(sample->data);
			sample->data = ibuffer;
		}
	}
	if (!(sample->flags & IT_SAMPLE_STEREO))
	{
		if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
				((short *)sample->data)[i] = old += iswapw(((short *)sample->data)[i]);
		}
		else
		{
			for (i = 0; i < sample->length; i++)
				((char *)sample->data)[i] = old += ((char *)sample->data)[i];
		}
	}
	return 0;
}